

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O0

MPP_RET mpp_ops_reset(MppDump info)

{
  undefined1 local_30 [8];
  AutoMutex auto_lock;
  MppDumpImpl *p;
  MppDump info_local;
  
  if (info != (MppDump)0x0) {
    auto_lock.mLock = (Mutex *)info;
    Mutex::Autolock::Autolock((Autolock *)local_30,*info,1);
    if (*(long *)((long)&auto_lock.mLock[1].mMutex + 0x10) != 0) {
      _ops_log(*(FILE **)((long)&auto_lock.mLock[1].mMutex + 0x10),"%d,%s\n",
               (ulong)(uint)auto_lock.mLock[2].mMutex.__data.__owner,"rst");
    }
    Mutex::Autolock::~Autolock((Autolock *)local_30);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_reset(MppDump info)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p)
        return MPP_OK;

    AutoMutex auto_lock(p->lock);

    if (p->fp_ops)
        ops_log(p->fp_ops, "%d,%s\n", p->idx, "rst");

    return MPP_OK;
}